

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventCount.hpp
# Opt level: O0

__pid_t __thiscall EventCount::wait(EventCount *this,void *__stat_loc)

{
  __int_type _Var1;
  memory_order __b;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  atomic<unsigned_int> *in_stack_ffffffffffffff80;
  
  while (std::operator&(memory_order_acquire,__memory_order_mask),
        (this->val_).super___atomic_base<unsigned_long>._M_i >> 0x20 ==
        ((ulong)__stat_loc & 0xffffffff)) {
    futexWait<std::atomic<unsigned_int>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  }
  LOCK();
  _Var1 = (this->val_).super___atomic_base<unsigned_long>._M_i;
  (this->val_).super___atomic_base<unsigned_long>._M_i =
       (this->val_).super___atomic_base<unsigned_long>._M_i - 1;
  UNLOCK();
  return (__pid_t)_Var1;
}

Assistant:

inline void EventCount::wait(Key key) noexcept {
    while ((val_.load(std::memory_order_acquire) >> kEpochShift) == key.epoch_) {

        futexWait(
                reinterpret_cast<Futex<std::atomic> *>(&val_) + kEpochOffset,
                key.epoch_);
    }
    // memory_order_relaxed would suffice for correctness, but the faster
    // #waiters gets to 0, the less likely it is that we'll do spurious wakeups
    // (and thus system calls)
//    uint64_t prev = val_.fetch_add(kSubWaiter, std::memory_order_seq_cst);
//    DCHECK_NE((prev & kWaiterMask), 0);
    val_.fetch_add(kSubWaiter, std::memory_order_seq_cst);
}